

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void Int64Sum(jx9_context *pCtx,jx9_hashmap *pMap)

{
  long local_40;
  sxi64 nv;
  long lStack_30;
  sxu32 n;
  sxi64 nSum;
  jx9_value *pObj;
  jx9_hashmap_node *pEntry;
  jx9_hashmap *pMap_local;
  jx9_context *pCtx_local;
  
  lStack_30 = 0;
  pObj = (jx9_value *)pMap->pFirst;
  pEntry = (jx9_hashmap_node *)pMap;
  pMap_local = (jx9_hashmap *)pCtx;
  for (nv._4_4_ = 0; nv._4_4_ < *(uint *)((long)&pEntry->xKey + 0x1c); nv._4_4_ = nv._4_4_ + 1) {
    nSum = (sxi64)HashmapExtractNodeValue((jx9_hashmap_node *)pObj);
    if (((jx9_value *)nSum != (jx9_value *)0x0) && ((((jx9_value *)nSum)->iFlags & 0x160U) == 0)) {
      if ((((jx9_value *)nSum)->iFlags & 4U) == 0) {
        if ((((jx9_value *)nSum)->iFlags & 10U) == 0) {
          if (((((jx9_value *)nSum)->iFlags & 1U) != 0) && ((((jx9_value *)nSum)->sBlob).nByte != 0)
             ) {
            local_40 = 0;
            SyStrToInt64((char *)(((jx9_value *)nSum)->sBlob).pBlob,
                         (((jx9_value *)nSum)->sBlob).nByte,&local_40,(char **)0x0);
            lStack_30 = local_40 + lStack_30;
          }
        }
        else {
          lStack_30 = (long)(((jx9_value *)nSum)->x).pOther + lStack_30;
        }
      }
      else {
        lStack_30 = (long)(((jx9_value *)nSum)->x).rVal + lStack_30;
      }
    }
    pObj = *(jx9_value **)&pObj[1].iFlags;
  }
  jx9_result_int64((jx9_context *)pMap_local,lStack_30);
  return;
}

Assistant:

static void Int64Sum(jx9_context *pCtx, jx9_hashmap *pMap)
{
	jx9_hashmap_node *pEntry;
	jx9_value *pObj;
	sxi64 nSum = 0;
	sxu32 n;
	pEntry = pMap->pFirst;
	for( n = 0 ; n < pMap->nEntry ; n++ ){
		pObj = HashmapExtractNodeValue(pEntry);
		if( pObj && (pObj->iFlags & (MEMOBJ_NULL|MEMOBJ_HASHMAP|MEMOBJ_RES)) == 0){
			if( pObj->iFlags & MEMOBJ_REAL ){
				nSum += (sxi64)pObj->x.rVal;
			}else if( pObj->iFlags & (MEMOBJ_INT|MEMOBJ_BOOL) ){
				nSum += pObj->x.iVal;
			}else if( pObj->iFlags & MEMOBJ_STRING ){
				if( SyBlobLength(&pObj->sBlob) > 0 ){
					sxi64 nv = 0;
					SyStrToInt64((const char *)SyBlobData(&pObj->sBlob), SyBlobLength(&pObj->sBlob), (void *)&nv, 0);
					nSum += nv;
				}
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	/* Return sum */
	jx9_result_int64(pCtx, nSum);
}